

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

void __thiscall zmq::stream_engine_base_t::~stream_engine_base_t(stream_engine_base_t *this)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  int in_ESI;
  undefined8 *in_RDI;
  char *errstr_1;
  int rc;
  char *errstr;
  int rc_1;
  options_t *this_00;
  
  *in_RDI = &PTR__stream_engine_base_t_003ea618;
  in_RDI[2] = &DAT_003ea6d8;
  if ((*(byte *)(in_RDI + 0xbf) & 1) != 0) {
    in_ESI = 0x32b5a3;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_plugged",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x90);
    fflush(_stderr);
    zmq_abort((char *)0x30745d);
  }
  if (*(int *)(in_RDI + 0xbd) != -1) {
    iVar3 = close(*(int *)(in_RDI + 0xbd));
    if (iVar3 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      in_ESI = 0x32b5b5;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
              ,0x9e);
      fflush(_stderr);
      zmq_abort((char *)0x3074fe);
    }
    *(undefined4 *)(in_RDI + 0xbd) = 0xffffffff;
  }
  iVar3 = msg_t::close((msg_t *)(in_RDI + 0xc0),in_ESI);
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xa4);
    fflush(_stderr);
    zmq_abort((char *)0x30759d);
  }
  if ((in_RDI[0xad] != 0) && (bVar2 = metadata_t::drop_ref((metadata_t *)0x3075c5), bVar2)) {
    pvVar1 = (void *)in_RDI[0xad];
    if (pvVar1 != (void *)0x0) {
      metadata_t::~metadata_t((metadata_t *)0x3075f6);
      operator_delete(pvVar1,0x38);
    }
    in_RDI[0xad] = 0;
  }
  if ((long *)in_RDI[0xa7] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0xa7] + 8))();
  }
  in_RDI[0xa7] = 0;
  if ((long *)in_RDI[0xa4] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0xa4] + 8))();
  }
  in_RDI[0xa4] = 0;
  this_00 = (options_t *)in_RDI[0xa8];
  if (this_00 != (options_t *)0x0) {
    (**(code **)(*(long *)this_00 + 8))();
  }
  in_RDI[0xa8] = 0;
  std::__cxx11::string::~string((string *)(in_RDI + 0xb9));
  endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)this_00);
  options_t::~options_t(this_00);
  i_engine::~i_engine((i_engine *)(in_RDI + 2));
  io_object_t::~io_object_t((io_object_t *)0x3076e6);
  return;
}

Assistant:

zmq::stream_engine_base_t::~stream_engine_base_t ()
{
    zmq_assert (!_plugged);

    if (_s != retired_fd) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (_s);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = close (_s);
#if defined(__FreeBSD_kernel__) || defined(__FreeBSD__)
        // FreeBSD may return ECONNRESET on close() under load but this is not
        // an error.
        if (rc == -1 && errno == ECONNRESET)
            rc = 0;
#endif
        errno_assert (rc == 0);
#endif
        _s = retired_fd;
    }

    const int rc = _tx_msg.close ();
    errno_assert (rc == 0);

    //  Drop reference to metadata and destroy it if we are
    //  the only user.
    if (_metadata != NULL) {
        if (_metadata->drop_ref ()) {
            LIBZMQ_DELETE (_metadata);
        }
    }

    LIBZMQ_DELETE (_encoder);
    LIBZMQ_DELETE (_decoder);
    LIBZMQ_DELETE (_mechanism);
}